

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O0

bool helics::fileops::isMember(value *element,string *key)

{
  bool bVar1;
  byte bVar2;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  basic_value<toml::type_config> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_value<toml::type_config> *in_stack_fffffffffffffe68;
  basic_value<toml::type_config> *in_stack_fffffffffffffe70;
  
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  toml::find_or<toml::type_config,std::__cxx11::string>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  bVar1 = toml::basic_value<toml::type_config>::is_empty((basic_value<toml::type_config> *)0x37b68c)
  ;
  bVar2 = bVar1 ^ 0xff;
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)
             (CONCAT17(bVar1,in_stack_fffffffffffffe40) ^ 0xff00000000000000));
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)CONCAT17(bVar2,in_stack_fffffffffffffe40));
  return (bool)(bVar2 & 1);
}

Assistant:

inline bool isMember(const toml::value& element, const std::string& key)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    return (!val.is_empty());
}